

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::build(TranslateToFuzzReader *this)

{
  bool bVar1;
  TranslateToFuzzReader *this_local;
  
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    prepareHangLimitSupport(this);
  }
  if ((this->allowMemory & 1U) != 0) {
    setupMemory(this);
  }
  setupHeapTypes(this);
  setupTables(this);
  setupGlobals(this);
  bVar1 = FeatureSet::hasExceptionHandling(&this->wasm->features);
  if (bVar1) {
    setupTags(this);
    addImportThrowingSupport(this);
  }
  bVar1 = FeatureSet::hasReferenceTypes(&this->wasm->features);
  if (bVar1) {
    addImportTableSupport(this);
  }
  addImportLoggingSupport(this);
  addImportCallingSupport(this);
  addImportSleepSupport(this);
  modifyInitialFunctions(this);
  processFunctions(this);
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    addHangLimitSupport(this);
  }
  if ((this->allowMemory & 1U) != 0) {
    finalizeMemory(this);
    addHashMemorySupport(this);
  }
  finalizeTable(this);
  shuffleExports(this);
  return;
}

Assistant:

void TranslateToFuzzReader::build() {
  if (fuzzParams->HANG_LIMIT > 0) {
    prepareHangLimitSupport();
  }
  if (allowMemory) {
    setupMemory();
  }
  setupHeapTypes();
  setupTables();
  setupGlobals();
  if (wasm.features.hasExceptionHandling()) {
    setupTags();
    addImportThrowingSupport();
  }
  if (wasm.features.hasReferenceTypes()) {
    addImportTableSupport();
  }
  addImportLoggingSupport();
  addImportCallingSupport();
  addImportSleepSupport();
  modifyInitialFunctions();
  processFunctions();
  if (fuzzParams->HANG_LIMIT > 0) {
    addHangLimitSupport();
  }
  if (allowMemory) {
    finalizeMemory();
    addHashMemorySupport();
  }
  finalizeTable();
  shuffleExports();
}